

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_intrapred_sse2.c
# Opt level: O3

void aom_highbd_dc_left_predictor_8x8_sse2
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  int iVar1;
  ushort uVar2;
  ushort uVar5;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar7 [16];
  short sVar6;
  short sVar8;
  short sVar9;
  short sVar10;
  
  auVar3 = *(undefined1 (*) [16])left;
  sVar6 = auVar3._8_2_;
  auVar7._0_2_ = sVar6 + auVar3._0_2_;
  sVar8 = auVar3._10_2_;
  auVar7._2_2_ = sVar8 + auVar3._2_2_;
  sVar9 = auVar3._12_2_;
  auVar7._4_2_ = sVar9 + auVar3._4_2_;
  sVar10 = auVar3._14_2_;
  auVar7._6_2_ = sVar10 + auVar3._6_2_;
  auVar7._8_2_ = sVar6;
  auVar7._10_2_ = sVar8;
  auVar7._12_2_ = sVar9;
  auVar7._14_2_ = sVar10;
  auVar3 = pshuflw(auVar3,auVar7,0xe);
  auVar4._0_2_ = auVar3._0_2_ + auVar7._0_2_;
  auVar4._2_2_ = auVar3._2_2_ + auVar7._2_2_;
  auVar4._4_2_ = auVar3._4_2_ + auVar7._4_2_;
  auVar4._6_2_ = auVar3._6_2_ + auVar7._6_2_;
  auVar4._8_2_ = auVar3._8_2_ + sVar6;
  auVar4._10_2_ = auVar3._10_2_ + sVar8;
  auVar4._12_2_ = auVar3._12_2_ + sVar9;
  auVar4._14_2_ = auVar3._14_2_ + sVar10;
  auVar3._0_2_ = auVar4._2_2_ + auVar4._0_2_ + 4;
  auVar3._2_2_ = auVar4._2_2_;
  auVar3._4_2_ = auVar4._6_2_ + auVar4._4_2_ + 4;
  auVar3._6_2_ = auVar4._6_2_;
  auVar3._8_2_ = auVar4._10_2_ + auVar4._8_2_ + 4;
  auVar3._10_2_ = auVar4._10_2_;
  auVar3._12_2_ = auVar4._14_2_ + auVar4._12_2_ + 4;
  auVar3._14_2_ = auVar4._14_2_;
  auVar3 = pshuflw(auVar4,auVar3,0);
  uVar2 = auVar3._0_2_;
  uVar5 = auVar3._2_2_;
  iVar1 = 8;
  do {
    *dst = uVar2 >> 3;
    dst[1] = uVar5 >> 3;
    dst[2] = uVar2 >> 3;
    dst[3] = uVar5 >> 3;
    dst[4] = uVar2 >> 3;
    dst[5] = uVar5 >> 3;
    dst[6] = uVar2 >> 3;
    dst[7] = uVar5 >> 3;
    dst = dst + stride;
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  return;
}

Assistant:

void aom_highbd_dc_left_predictor_8x8_sse2(uint16_t *dst, ptrdiff_t stride,
                                           const uint16_t *above,
                                           const uint16_t *left, int bd) {
  const __m128i four = _mm_cvtsi32_si128(4);
  const __m128i sum = dc_sum_8(left);
  const __m128i dc = _mm_srli_epi16(_mm_add_epi16(sum, four), 3);
  (void)above;
  (void)bd;
  dc_store_8xh(dst, stride, 8, &dc);
}